

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O0

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  reference pvVar9;
  const_reference instance;
  reference this_00;
  int local_118;
  int cost_diff;
  int i_1;
  int best_diff;
  int best_alt;
  undefined1 local_e8 [8];
  Plan plan;
  undefined1 local_c0 [4];
  int i;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  undefined1 local_88 [3];
  bool convergence;
  int iteration_counter;
  int local_68;
  int id;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> costs;
  int theta_local;
  Scenario *scenario_local;
  vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
  *instances_local;
  vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
  *agents_local;
  MultiAgentPlanner *this_local;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans;
  
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = theta;
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  sVar4 = std::
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          ::size(agents);
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,sVar4,&local_51);
  std::allocator<int>::~allocator(&local_51);
  for (local_68 = 0; uVar5 = (ulong)local_68,
      sVar4 = std::
              vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
              ::size(agents), uVar5 < sVar4; local_68 = local_68 + 1) {
    pvVar6 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
             operator[](__return_storage_ptr__,(long)local_68);
    Plan::Plan((Plan *)local_88,pvVar6);
    iVar3 = evaluate_one_plan(this,__return_storage_ptr__,scenario,(Plan *)local_88,local_68);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_68);
    *pvVar7 = iVar3;
    Plan::~Plan((Plan *)local_88);
  }
  alternativePlans.
  super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  bVar2 = false;
  while (!bVar2 && alternativePlans.
                   super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
                   costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_) {
    poVar8 = std::operator<<((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,alternativePlans.
                               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8," !!!!!!!!!!!!");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::vector
              ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
               &alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_c0);
    for (plan._28_4_ = 0; uVar5 = (ulong)(int)plan._28_4_,
        sVar4 = std::
                vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                ::size(agents), uVar5 < sVar4; plan._28_4_ = plan._28_4_ + 1) {
      pvVar9 = std::
               vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
               ::operator[](agents,(long)(int)plan._28_4_);
      instance = std::
                 vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                 ::operator[](instances,(long)(int)plan._28_4_);
      PlanningAgent::computeInterDependentPlan
                ((Plan *)local_e8,pvVar9,instance,scenario,__return_storage_ptr__,1.0);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
      push_back((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                &alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(value_type *)local_e8);
      pvVar9 = std::
               vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
               ::operator[](agents,(long)(int)plan._28_4_);
      PlanningAgent::planToString_abi_cxx11_((string *)&best_alt,pvVar9,(Plan *)local_e8);
      std::operator<<((ostream *)&std::cout,(string *)&best_alt);
      std::__cxx11::string::~string((string *)&best_alt);
      best_diff = (int)plan.actions.
                       super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_c0,&best_diff);
      Plan::~Plan((Plan *)local_e8);
    }
    i_1 = 0;
    cost_diff = 0;
    bVar2 = true;
    for (local_118 = 0;
        sVar4 = std::
                vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                ::size(agents), (ulong)(long)local_118 < sVar4; local_118 = local_118 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,(long)local_118);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_c0,(long)local_118);
      iVar3 = iVar3 - *pvVar7;
      if (0 < iVar3) {
        bVar2 = false;
      }
      if (cost_diff < iVar3) {
        i_1 = local_118;
        cost_diff = iVar3;
      }
    }
    if (!bVar2) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Agent ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,i_1);
      poVar8 = std::operator<<(poVar8," wins!");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    pvVar6 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
             operator[]((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                         *)&alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)i_1);
    this_00 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
              operator[](__return_storage_ptr__,(long)i_1);
    Plan::operator=(this_00,pvVar6);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_c0,(long)i_1);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)i_1);
    *pvVar7 = vVar1;
    alternativePlans.
    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         alternativePlans.
         super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
              ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
               &alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  if ((costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<Plan> alternativePlans;
		vector<int> alternativeCosts;

		for (int i = 0; i < agents.size(); ++i) {
			Plan plan = agents[i].computeInterDependentPlan(instances[i], scenario, plans);

			alternativePlans.push_back(plan);

			cout << agents[i].planToString(plan);

			alternativeCosts.push_back(plan.cost);

			//int alt_plan_cost = evaluate_one_plan(plans, scenario, plan, i);
			
			//alternativeCosts.push_back(alt_plan_cost);

			//cout << "Inter-dependent plan cost: " << alt_plan_cost << endl;
		}

		int best_alt = 0;
		int best_diff = 0;
		convergence = true;
		
		for (int i = 0; i < agents.size(); ++i) {
			int cost_diff = costs[i] - alternativeCosts[i];

			if (cost_diff > 0) {
				convergence = false;
			}
			
			if (cost_diff > best_diff) {
				best_diff = cost_diff;
				best_alt = i;
			}
		}

		if (! convergence) {
			cout << "Agent " << best_alt << " wins!" << endl;
		}

		plans[best_alt] = alternativePlans[best_alt];
		costs[best_alt] = alternativeCosts[best_alt];

		iteration_counter++;

	}

	return plans;
}